

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_case_info.hpp
# Opt level: O1

SpecialProperties Catch::parseSpecialTag(string *tag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
  bVar2 = startsWith(tag,&local_40);
  if ((bVar2) || (iVar3 = std::__cxx11::string::compare((char *)tag), iVar3 == 0)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)tag);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)tag);
      if (iVar3 == 0) {
        return Throws;
      }
      iVar3 = std::__cxx11::string::compare((char *)tag);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)tag);
        return (uint)(iVar3 == 0) << 3;
      }
      return ShouldFail;
    }
  }
  return IsHidden;
}

Assistant:

inline TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
        if( startsWith( tag, "." ) ||
            tag == "hide" ||
            tag == "!hide" )
            return TestCaseInfo::IsHidden;
        else if( tag == "!throws" )
            return TestCaseInfo::Throws;
        else if( tag == "!shouldfail" )
            return TestCaseInfo::ShouldFail;
        else if( tag == "!mayfail" )
            return TestCaseInfo::MayFail;
        else
            return TestCaseInfo::None;
    }